

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

int __thiscall
sznet::net::Connector::connect(Connector *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint uVar1;
  sz_sock sockfd;
  int iVar2;
  uint v;
  int extraout_EAX;
  int extraout_EAX_00;
  sockaddr *addr;
  self *psVar3;
  SourceFile file;
  SourceFile file_00;
  Logger local_1010;
  undefined1 local_40 [12];
  undefined1 local_30 [12];
  
  sockfd = sockets::sz_sock_createnonblockingordie
                     ((uint)(this->m_serverAddr).field_0.m_addr.sin_family);
  addr = sockets::sz_sockaddr_cast((sockaddr_in6 *)&this->m_serverAddr);
  iVar2 = sockets::sz_sock_connect(sockfd,addr);
  if (iVar2 == 0) goto LAB_0012f408;
  v = sz_getlasterr();
  uVar1 = v - 0x58;
  if (uVar1 < 0x1c) {
    if ((0x802c00U >> (uVar1 & 0x1f) & 1) != 0) goto LAB_0012f425;
    if ((0x4000201U >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0x8040000U >> (uVar1 & 0x1f) & 1) != 0) goto LAB_0012f408;
      goto LAB_0012f37f;
    }
LAB_0012f394:
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_40,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_40._0_8_;
    file.m_size = local_40._8_4_;
    Logger::Logger(&local_1010,file,0x6e,false);
    psVar3 = LogStream::operator<<
                       (&local_1010.m_impl.m_stream,"connect error in Connector::startInLoop ");
    LogStream::operator<<(psVar3,v);
  }
  else {
LAB_0012f37f:
    if (v < 0xf) {
      if ((0x6202U >> (v & 0x1f) & 1) != 0) goto LAB_0012f394;
      if ((0x11U >> (v & 0x1f) & 1) != 0) {
LAB_0012f408:
        connecting(this,sockfd);
        return extraout_EAX;
      }
      if (v == 0xb) {
LAB_0012f425:
        retry(this,sockfd);
        return extraout_EAX_00;
      }
    }
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_30,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
              );
    file_00._12_4_ = 0;
    file_00.m_data = (char *)local_30._0_8_;
    file_00.m_size = local_30._8_4_;
    Logger::Logger(&local_1010,file_00,0x72,false);
    psVar3 = LogStream::operator<<
                       (&local_1010.m_impl.m_stream,"Unexpected error in Connector::startInLoop ");
    LogStream::operator<<(psVar3,v);
  }
  Logger::~Logger(&local_1010);
  iVar2 = sockets::sz_closesocket(sockfd);
  return iVar2;
}

Assistant:

void Connector::connect()
{
	sockets::sz_sock sockfd = sockets::sz_sock_createnonblockingordie(m_serverAddr.family());
	int ret = sockets::sz_sock_connect(sockfd, m_serverAddr.getSockAddr());
	int savedErrno = (ret == 0) ? 0 : sz_getlasterr();
	switch (savedErrno)
	{
	// ���ӳɹ�
	case 0:
	case sz_err_inprogress:
	// ���ﲻ�԰ɣ�
	case sz_err_eintr:
	case sz_err_eisconn:
#ifdef SZ_OS_WINDOWS
	case sz_err_wouldblock:
#endif
		connecting(sockfd);
		break;
#ifdef SZ_OS_LINUX
	case sz_err_again:
#endif
	case sz_err_eaddrinuse:
	case sz_err_eaddrnotavail:
	case sz_err_econnrefused:
	case sz_err_enetunreach:
		retry(sockfd);
		break;
	case sz_err_eacces:
#ifdef SZ_OS_LINUX
	case sz_err_eperm:
#endif
	case sz_err_eafnosupport:
	case sz_err_ealready:
	case sz_err_ebadf:
	case sz_err_efault:
	case sz_err_enotsock:
		LOG_SYSERR << "connect error in Connector::startInLoop " << savedErrno;
		sockets::sz_closesocket(sockfd);
		break;
	default:
		LOG_SYSERR << "Unexpected error in Connector::startInLoop " << savedErrno;
		sockets::sz_closesocket(sockfd);
		break;
	}
}